

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-open.c
# Opt level: O1

void write1_cb(uv_write_t *req,int status)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 extraout_RAX;
  undefined1 *puVar3;
  long *extraout_RDX;
  uv_write_t *unaff_RBX;
  undefined8 *puVar4;
  uv_handle_t *handle;
  undefined8 in_R9;
  int64_t eval_b;
  int64_t eval_a;
  uv_buf_t uStack_100;
  undefined8 uStack_e8;
  code *pcStack_e0;
  long lStack_d0;
  long lStack_c8;
  sockaddr_in sStack_c0;
  uv_connect_t uStack_b0;
  uv_write_t *puStack_48;
  undefined8 uStack_40;
  undefined1 *puStack_38;
  uv_write_t *puStack_30;
  undefined8 local_28;
  undefined1 local_20 [8];
  uv_buf_t local_18;
  
  puVar4 = &local_28;
  if (req == (uv_write_t *)0x0) {
    puStack_30 = (uv_write_t *)0x1ca22a;
    write1_cb_cold_3();
  }
  else {
    unaff_RBX = req;
    if (status != 0) {
      if (shutdown_cb_called != 0) {
        return;
      }
      puStack_30 = (uv_write_t *)0x1ca1b7;
      write1_cb_cold_1();
      unaff_RBX = req;
    }
    if (shutdown_requested != 0) {
      return;
    }
    puStack_30 = (uv_write_t *)0x1ca1d4;
    local_18 = uv_buf_init("P",1);
    puStack_30 = (uv_write_t *)0x1ca1ff;
    iVar1 = uv_write(&write_req,unaff_RBX->handle,&local_18,1,write1_cb);
    local_20 = (undefined1  [8])(long)iVar1;
    local_28 = 0;
    if (local_20 == (undefined1  [8])0x0) {
      write_cb_called = write_cb_called + 1;
      return;
    }
  }
  handle = (uv_handle_t *)local_20;
  puStack_30 = (uv_write_t *)read1_cb;
  write1_cb_cold_2();
  puStack_30 = unaff_RBX;
  if (handle == (uv_handle_t *)0x0) {
LAB_001ca2c0:
    puStack_48 = (uv_write_t *)0x1ca2c5;
    read1_cb_cold_3();
  }
  else {
    if (-1 < (long)puVar4) {
      if (puVar4 != (undefined8 *)0x0) {
        puVar3 = (undefined1 *)0x0;
        do {
          puStack_38 = (undefined1 *)(long)(char)puVar3[*extraout_RDX];
          uStack_40 = 0x50;
          if (puStack_38 != (undefined1 *)0x50) {
            puStack_48 = (uv_write_t *)0x1ca2c0;
            read1_cb_cold_2();
            goto LAB_001ca2c0;
          }
          puVar3 = puVar3 + 1;
        } while (puVar4 != (undefined8 *)puVar3);
      }
      return;
    }
    uStack_40 = 0xfffffffffffff001;
    puStack_38 = (undefined1 *)puVar4;
    if (puVar4 == (undefined8 *)0xfffffffffffff001) {
      puStack_48 = (uv_write_t *)0x1ca29f;
      puts("GOT EOF");
      uv_close(handle,close_cb);
      return;
    }
  }
  puStack_48 = (uv_write_t *)0x1ca2d2;
  read1_cb_cold_1();
  pcStack_e0 = (code *)0x1ca2f2;
  puStack_48 = unaff_RBX;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_c0);
  uStack_b0.data = (void *)(long)iVar1;
  lStack_d0 = 0;
  if (uStack_b0.data == (void *)0x0) {
    pcStack_e0 = (code *)0x1ca317;
    puVar2 = uv_default_loop();
    pcStack_e0 = (code *)0x1ca326;
    iVar1 = uv_timer_init(puVar2,&timer_handle);
    uStack_b0.data = (void *)(long)iVar1;
    lStack_d0 = 0;
    if (uStack_b0.data != (void *)0x0) goto LAB_001ca451;
    pcStack_e0 = (code *)0x1ca34b;
    puVar2 = uv_default_loop();
    pcStack_e0 = (code *)0x1ca35a;
    iVar1 = uv_tcp_init(puVar2,&tcp_handle);
    uStack_b0.data = (void *)(long)iVar1;
    lStack_d0 = 0;
    if (uStack_b0.data != (void *)0x0) goto LAB_001ca460;
    pcStack_e0 = (code *)0x1ca397;
    iVar1 = uv_tcp_connect(&uStack_b0,&tcp_handle,(sockaddr *)&sStack_c0,connect_cb);
    lStack_d0 = (long)iVar1;
    lStack_c8 = 0;
    if (lStack_d0 != 0) goto LAB_001ca46f;
    pcStack_e0 = (code *)0x1ca3bc;
    puVar2 = uv_default_loop();
    pcStack_e0 = (code *)0x1ca3c6;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    lStack_d0 = (long)iVar1;
    lStack_c8 = 0;
    if (lStack_d0 != 0) goto LAB_001ca47e;
    pcStack_e0 = (code *)0x1ca3eb;
    puVar2 = uv_default_loop();
    pcStack_e0 = (code *)0x1ca3ff;
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    pcStack_e0 = (code *)0x1ca409;
    uv_run(puVar2,UV_RUN_DEFAULT);
    lStack_d0 = 0;
    pcStack_e0 = (code *)0x1ca417;
    puVar2 = uv_default_loop();
    pcStack_e0 = (code *)0x1ca41f;
    iVar1 = uv_loop_close(puVar2);
    lStack_c8 = (long)iVar1;
    if (lStack_d0 == lStack_c8) {
      pcStack_e0 = (code *)0x1ca437;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_e0 = (code *)0x1ca451;
    run_test_tcp_read_stop_cold_1();
LAB_001ca451:
    pcStack_e0 = (code *)0x1ca460;
    run_test_tcp_read_stop_cold_2();
LAB_001ca460:
    pcStack_e0 = (code *)0x1ca46f;
    run_test_tcp_read_stop_cold_3();
LAB_001ca46f:
    pcStack_e0 = (code *)0x1ca47e;
    run_test_tcp_read_stop_cold_4();
LAB_001ca47e:
    pcStack_e0 = (code *)0x1ca48d;
    run_test_tcp_read_stop_cold_5();
  }
  iVar1 = (int)&lStack_c8;
  pcStack_e0 = connect_cb;
  run_test_tcp_read_stop_cold_6();
  pcStack_e0 = (code *)(long)iVar1;
  uStack_e8 = 0;
  if (pcStack_e0 == (code *)0x0) {
    uStack_100.len = 0x1ca4d7;
    iVar1 = uv_timer_start(&timer_handle,timer_cb,0x32,0);
    pcStack_e0 = (code *)(long)iVar1;
    uStack_e8 = 0;
    if (pcStack_e0 == (code *)0x0) {
      uStack_100.len = 0x1ca509;
      iVar1 = uv_read_start((uv_stream_t *)&tcp_handle,fail_cb,fail_cb);
      pcStack_e0 = (code *)(long)iVar1;
      uStack_e8 = 0;
      if (pcStack_e0 == (code *)0x0) {
        return;
      }
      goto LAB_001ca548;
    }
  }
  else {
    uStack_100.len = 0x1ca539;
    connect_cb_cold_1();
  }
  uStack_100.len = 0x1ca548;
  connect_cb_cold_2();
LAB_001ca548:
  uStack_100.len = (size_t)timer_cb;
  connect_cb_cold_3();
  uStack_100 = uv_buf_init("PING",4);
  iVar1 = uv_write(&write_req,(uv_stream_t *)&tcp_handle,&uStack_100,1,write_cb);
  if (iVar1 == 0) {
    iVar1 = uv_read_stop((uv_stream_t *)&tcp_handle);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    timer_cb_cold_1();
  }
  timer_cb_cold_2();
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-read-stop.c"
          ,0x1f,"0 && \"fail_cb called\"",in_R9,extraout_RAX);
  abort();
}

Assistant:

static void write1_cb(uv_write_t* req, int status) {
  uv_buf_t buf;
  int r;

  ASSERT_NOT_NULL(req);
  if (status) {
    ASSERT(shutdown_cb_called);
    return;
  }

  if (shutdown_requested)
    return;

  buf = uv_buf_init("P", 1);
  r = uv_write(&write_req, req->handle, &buf, 1, write1_cb);
  ASSERT_OK(r);

  write_cb_called++;
}